

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  U32 *pUVar12;
  long lVar13;
  uint uVar14;
  size_t sVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  BYTE *pBVar24;
  seqDef *psVar25;
  BYTE *ip;
  BYTE *pBVar26;
  BYTE *pBVar27;
  ulong *puVar28;
  U32 UVar29;
  uint uVar30;
  int iVar31;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ulong *local_138;
  uint local_12c;
  ulong local_128;
  uint local_114;
  ulong local_f0;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar10 = (ms->window).base;
  pBVar11 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar10 + uVar5;
  local_12c = *rep;
  local_114 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_138 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar4 <= local_138) {
LAB_00488302:
    *rep = local_12c;
    rep[1] = local_114;
    return (long)iEnd - (long)src;
  }
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
LAB_00487713:
  puVar20 = (ulong *)((long)local_138 + 1);
  UVar29 = (U32)local_138;
  uVar14 = ((UVar29 - (int)pBVar10) - local_12c) + 1;
  pBVar27 = pBVar10;
  if (uVar14 < uVar5) {
    pBVar27 = pBVar11;
  }
  if ((uVar14 <= uVar6 || (uVar5 - 1) - uVar14 < 3) ||
     (*(int *)puVar20 != *(int *)(pBVar27 + uVar14))) {
    uVar14 = (ms->cParams).minMatch;
    if (uVar14 - 6 < 2) {
      pUVar12 = ms->chainTable;
      uVar14 = (ms->cParams).chainLog;
      uVar30 = 1 << ((byte)uVar14 & 0x1f);
      pBVar27 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar7 = (ms->window).dictLimit;
      uVar8 = (ms->window).lowLimit;
      uVar21 = UVar29 - (int)pBVar27;
      uVar22 = uVar21 - uVar30;
      if (uVar21 < uVar30) {
        uVar22 = 0;
      }
      uVar9 = (ms->cParams).searchLog;
      uVar14 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar29);
      if (uVar8 < uVar14) {
        iVar31 = 1 << ((byte)uVar9 & 0x1f);
        local_f0 = 999999999;
        local_128 = 3;
        do {
          uVar19 = (ulong)uVar14;
          if (uVar14 < uVar7) {
            if (*(int *)(pBVar24 + uVar19) == (int)*local_138) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_138 + 4),pBVar24 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar7,pBVar27 + uVar7);
              uVar19 = sVar15 + 4;
LAB_00487a2e:
              if ((local_128 < uVar19) &&
                 (local_f0 = (ulong)((uVar21 + 2) - uVar14), local_128 = uVar19,
                 (ulong *)((long)local_138 + uVar19) == iEnd)) goto LAB_0048800a;
            }
          }
          else {
            puVar28 = (ulong *)(pBVar27 + uVar19);
            if (*(BYTE *)(local_128 + (long)puVar28) == *(BYTE *)((long)local_138 + local_128)) {
              puVar16 = local_138;
              if (local_138 < puVar1) {
                if (*puVar28 == *local_138) {
                  lVar23 = 0;
                  do {
                    puVar16 = (ulong *)((long)local_138 + lVar23 + 8);
                    if (puVar1 <= puVar16) {
                      puVar28 = (ulong *)(pBVar27 + lVar23 + uVar19 + 8);
                      goto LAB_004879e5;
                    }
                    lVar13 = lVar23 + uVar19 + 8;
                    lVar23 = lVar23 + 8;
                  } while (*(ulong *)(pBVar27 + lVar13) == *puVar16);
                  uVar17 = *puVar16 ^ *(ulong *)(pBVar27 + lVar13);
                  uVar19 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar23;
                }
                else {
                  uVar17 = *local_138 ^ *puVar28;
                  uVar19 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004879e5:
                if ((puVar16 < puVar2) && ((int)*puVar28 == (int)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar16 < puVar3) && ((short)*puVar28 == (short)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar16 < iEnd) {
                  puVar16 = (ulong *)((long)puVar16 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar16));
                }
                uVar19 = (long)puVar16 - (long)local_138;
              }
              goto LAB_00487a2e;
            }
          }
          if ((uVar14 <= uVar22) ||
             ((uVar14 = pUVar12[uVar14 & uVar30 - 1], uVar14 <= uVar8 ||
              (iVar31 = iVar31 + -1, iVar31 == 0)))) goto LAB_0048800a;
        } while( true );
      }
    }
    else if (uVar14 == 5) {
      pUVar12 = ms->chainTable;
      uVar14 = (ms->cParams).chainLog;
      uVar30 = 1 << ((byte)uVar14 & 0x1f);
      pBVar27 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar7 = (ms->window).dictLimit;
      uVar8 = (ms->window).lowLimit;
      uVar22 = UVar29 - (int)pBVar27;
      uVar21 = uVar22 - uVar30;
      if (uVar22 < uVar30) {
        uVar21 = 0;
      }
      uVar9 = (ms->cParams).searchLog;
      uVar14 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar29);
      if (uVar8 < uVar14) {
        iVar31 = 1 << ((byte)uVar9 & 0x1f);
        local_f0 = 999999999;
        local_128 = 3;
        do {
          uVar19 = (ulong)uVar14;
          if (uVar14 < uVar7) {
            if (*(int *)(pBVar24 + uVar19) == (int)*local_138) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_138 + 4),pBVar24 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar7,pBVar27 + uVar7);
              uVar19 = sVar15 + 4;
LAB_00487d03:
              if ((local_128 < uVar19) &&
                 (local_f0 = (ulong)((uVar22 + 2) - uVar14), local_128 = uVar19,
                 (ulong *)((long)local_138 + uVar19) == iEnd)) goto LAB_0048800a;
            }
          }
          else {
            puVar28 = (ulong *)(pBVar27 + uVar19);
            if (*(BYTE *)(local_128 + (long)puVar28) == *(BYTE *)((long)local_138 + local_128)) {
              puVar16 = local_138;
              if (local_138 < puVar1) {
                if (*puVar28 == *local_138) {
                  lVar23 = 0;
                  do {
                    puVar16 = (ulong *)((long)local_138 + lVar23 + 8);
                    if (puVar1 <= puVar16) {
                      puVar28 = (ulong *)(pBVar27 + lVar23 + uVar19 + 8);
                      goto LAB_00487cba;
                    }
                    lVar13 = lVar23 + uVar19 + 8;
                    lVar23 = lVar23 + 8;
                  } while (*(ulong *)(pBVar27 + lVar13) == *puVar16);
                  uVar17 = *puVar16 ^ *(ulong *)(pBVar27 + lVar13);
                  uVar19 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar23;
                }
                else {
                  uVar17 = *local_138 ^ *puVar28;
                  uVar19 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00487cba:
                if ((puVar16 < puVar2) && ((int)*puVar28 == (int)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar16 < puVar3) && ((short)*puVar28 == (short)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar16 < iEnd) {
                  puVar16 = (ulong *)((long)puVar16 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar16));
                }
                uVar19 = (long)puVar16 - (long)local_138;
              }
              goto LAB_00487d03;
            }
          }
          if ((uVar14 <= uVar21) ||
             ((uVar14 = pUVar12[uVar14 & uVar30 - 1], uVar14 <= uVar8 ||
              (iVar31 = iVar31 + -1, iVar31 == 0)))) goto LAB_0048800a;
        } while( true );
      }
    }
    else {
      pUVar12 = ms->chainTable;
      uVar14 = (ms->cParams).chainLog;
      uVar30 = 1 << ((byte)uVar14 & 0x1f);
      pBVar27 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar7 = (ms->window).dictLimit;
      uVar8 = (ms->window).lowLimit;
      uVar22 = UVar29 - (int)pBVar27;
      uVar21 = uVar22 - uVar30;
      if (uVar22 < uVar30) {
        uVar21 = 0;
      }
      uVar9 = (ms->cParams).searchLog;
      uVar14 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar29);
      if (uVar8 < uVar14) {
        iVar31 = 1 << ((byte)uVar9 & 0x1f);
        local_f0 = 999999999;
        uVar19 = 3;
        do {
          uVar17 = (ulong)uVar14;
          if (uVar14 < uVar7) {
            if (*(int *)(pBVar24 + uVar17) == (int)*local_138) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_138 + 4),pBVar24 + uVar17 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar7,pBVar27 + uVar7);
              local_128 = sVar15 + 4;
LAB_00487fc3:
              if ((uVar19 < local_128) &&
                 (local_f0 = (ulong)((uVar22 + 2) - uVar14), uVar19 = local_128,
                 (ulong *)((long)local_138 + local_128) == iEnd)) goto LAB_0048800a;
            }
          }
          else {
            puVar28 = (ulong *)(pBVar27 + uVar17);
            if (*(BYTE *)(uVar19 + (long)puVar28) == *(BYTE *)((long)local_138 + uVar19)) {
              puVar16 = local_138;
              if (local_138 < puVar1) {
                if (*puVar28 == *local_138) {
                  lVar23 = 0;
                  do {
                    puVar16 = (ulong *)((long)local_138 + lVar23 + 8);
                    if (puVar1 <= puVar16) {
                      puVar28 = (ulong *)(pBVar27 + lVar23 + uVar17 + 8);
                      goto LAB_00487f7a;
                    }
                    lVar13 = lVar23 + uVar17 + 8;
                    lVar23 = lVar23 + 8;
                  } while (*(ulong *)(pBVar27 + lVar13) == *puVar16);
                  uVar18 = *puVar16 ^ *(ulong *)(pBVar27 + lVar13);
                  uVar17 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  local_128 = (uVar17 >> 3 & 0x1fffffff) + lVar23;
                }
                else {
                  uVar18 = *local_138 ^ *puVar28;
                  uVar17 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  local_128 = uVar17 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00487f7a:
                if ((puVar16 < puVar2) && ((int)*puVar28 == (int)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 4);
                  puVar28 = (ulong *)((long)puVar28 + 4);
                }
                if ((puVar16 < puVar3) && ((short)*puVar28 == (short)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 2);
                  puVar28 = (ulong *)((long)puVar28 + 2);
                }
                if (puVar16 < iEnd) {
                  puVar16 = (ulong *)((long)puVar16 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar16));
                }
                local_128 = (long)puVar16 - (long)local_138;
              }
              goto LAB_00487fc3;
            }
          }
          local_128 = uVar19;
          if ((uVar14 <= uVar21) ||
             ((uVar14 = pUVar12[uVar14 & uVar30 - 1], uVar14 <= uVar8 ||
              (iVar31 = iVar31 + -1, uVar19 = local_128, iVar31 == 0)))) goto LAB_0048800a;
        } while( true );
      }
    }
    goto LAB_00488025;
  }
  puVar28 = iEnd;
  if (uVar14 < uVar5) {
    puVar28 = (ulong *)(pBVar11 + uVar5);
  }
  sVar15 = ZSTD_count_2segments
                     ((BYTE *)((long)local_138 + 5),(BYTE *)((long)(pBVar27 + uVar14) + 4),
                      (BYTE *)iEnd,(BYTE *)puVar28,iStart);
  UVar29 = 1;
  local_128 = sVar15 + 4;
  goto LAB_00488133;
LAB_0048800a:
  if (local_128 != 0) {
    puVar20 = local_138;
  }
  if (local_128 < 4) {
LAB_00488025:
    local_138 = (ulong *)((long)local_138 + ((long)local_138 - (long)src >> 8) + 1);
  }
  else {
    if (local_f0 == 0) {
      UVar29 = 1;
    }
    else {
      pBVar26 = (BYTE *)((long)local_138 + (2 - (long)(pBVar10 + local_f0)));
      pBVar24 = iStart;
      pBVar27 = pBVar10;
      if ((uint)pBVar26 < uVar5) {
        pBVar24 = pBVar11 + uVar6;
        pBVar27 = pBVar11;
      }
      uVar19 = local_128;
      if ((src < local_138) && (uVar17 = (ulong)pBVar26 & 0xffffffff, pBVar24 < pBVar27 + uVar17)) {
        pBVar27 = pBVar27 + uVar17;
        do {
          puVar28 = (ulong *)((long)puVar20 + -1);
          pBVar27 = pBVar27 + -1;
          if ((*(BYTE *)puVar28 != *pBVar27) ||
             (uVar19 = uVar19 + 1, puVar20 = puVar28, puVar28 <= src)) break;
        } while (pBVar24 < pBVar27);
      }
      iVar31 = (int)local_f0;
      if (local_128 == 0) {
        iVar31 = 0;
      }
      local_114 = local_12c;
      local_12c = iVar31 - 2;
      UVar29 = iVar31 + 1;
      local_128 = uVar19;
    }
LAB_00488133:
    uVar19 = (long)puVar20 - (long)src;
    puVar16 = (ulong *)seqStore->lit;
    puVar28 = (ulong *)((long)puVar16 + uVar19);
    do {
      *puVar16 = *src;
      puVar16 = puVar16 + 1;
      src = (void *)((long)src + 8);
    } while (puVar16 < puVar28);
    seqStore->lit = seqStore->lit + uVar19;
    if (uVar19 < 0x10000) {
      psVar25 = seqStore->sequences;
    }
    else {
      seqStore->longLengthID = 1;
      psVar25 = seqStore->sequences;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar25->litLength = (U16)uVar19;
    psVar25->offset = UVar29;
    if (0xffff < local_128 - 3) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar25->matchLength = (U16)(local_128 - 3);
    seqStore->sequences = psVar25 + 1;
    uVar14 = local_12c;
    for (src = (void *)((long)puVar20 + local_128); local_12c = uVar14, local_138 = (ulong *)src,
        src <= puVar4; src = (void *)((long)src + sVar15 + 4)) {
      uVar14 = (uint)((long)src - (long)(pBVar10 + local_114));
      pBVar27 = pBVar10;
      if (uVar14 < uVar5) {
        pBVar27 = pBVar11;
      }
      if (((uVar14 <= uVar6) || ((uVar5 - 1) - uVar14 < 3)) ||
         ((int)*src != *(int *)(pBVar27 + ((long)src - (long)(pBVar10 + local_114) & 0xffffffff))))
      break;
      puVar20 = iEnd;
      if (uVar14 < uVar5) {
        puVar20 = (ulong *)(pBVar11 + uVar5);
      }
      sVar15 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),
                          (BYTE *)((long)(pBVar27 +
                                         ((long)src - (long)(pBVar10 + local_114) & 0xffffffff)) + 4
                                  ),(BYTE *)iEnd,(BYTE *)puVar20,iStart);
      *(ulong *)seqStore->lit = *src;
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < sVar15 + 1) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(sVar15 + 1);
      seqStore->sequences = psVar25 + 1;
      uVar14 = local_114;
      local_114 = local_12c;
    }
  }
  if (puVar4 <= local_138) goto LAB_00488302;
  goto LAB_00487713;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 0, 0);
}